

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

double mjs::to_integer(value *v)

{
  double dVar1;
  
  dVar1 = to_number(v);
  dVar1 = to_integer(dVar1);
  return dVar1;
}

Assistant:

double to_integer(const value& v) {
    return to_integer(to_number(v));
}